

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assembler.h
# Opt level: O1

void __thiscall ArmipsArguments::ArmipsArguments(ArmipsArguments *this)

{
  (this->labels).super__Vector_base<LabelDefinition,_std::allocator<LabelDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->labels).super__Vector_base<LabelDefinition,_std::allocator<LabelDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->equList).super__Vector_base<EquationDefinition,_std::allocator<EquationDefinition>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->labels).super__Vector_base<LabelDefinition,_std::allocator<LabelDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->equList).super__Vector_base<EquationDefinition,_std::allocator<EquationDefinition>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->equList).super__Vector_base<EquationDefinition,_std::allocator<EquationDefinition>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ghc::filesystem::path::path(&this->inputFileName);
  ghc::filesystem::path::path(&this->tempFileName);
  ghc::filesystem::path::path(&this->symFileName);
  (this->memoryFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->memoryFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->content)._M_dataplus._M_p = (pointer)&(this->content).field_2;
  (this->content)._M_string_length = 0;
  (this->content).field_2._M_local_buf[0] = '\0';
  this->errorsResult =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  this->mode = FILE;
  this->symFileVersion = 0;
  *(undefined4 *)((long)&this->symFileVersion + 3) = 0;
  this->useAbsoluteFileNames = true;
  return;
}

Assistant:

ArmipsArguments()
	{
		mode = ArmipsMode::FILE;
		symFileVersion = 0;
		errorOnWarning = false;
		silent = false;
		showStats = false;
		errorsResult = nullptr;
		useAbsoluteFileNames = true;
	}